

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggressive_dead_code_elim_pass.cpp
# Opt level: O3

bool __thiscall
spvtools::opt::AggressiveDCEPass::BlockIsInConstruct
          (AggressiveDCEPass *this,BasicBlock *header_block,BasicBlock *bb)

{
  Instruction *pIVar1;
  IRContext *this_00;
  uint32_t uVar2;
  uint32_t uVar3;
  undefined8 in_RAX;
  iterator iVar4;
  bool bVar5;
  undefined8 uStack_38;
  
  if (((header_block == (BasicBlock *)0x0 || bb == (BasicBlock *)0x0) ||
      (pIVar1 = (bb->label_)._M_t.
                super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                ._M_t.
                super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
                .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl,
      pIVar1->has_result_id_ != true)) ||
     (uStack_38 = in_RAX,
     uVar2 = Instruction::GetSingleWordOperand(pIVar1,(uint)pIVar1->has_type_id_), uVar2 == 0)) {
LAB_005211e4:
    bVar5 = false;
  }
  else {
    do {
      pIVar1 = (header_block->label_)._M_t.
               super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
               ._M_t.
               super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
               .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
      uVar3 = 0;
      if (pIVar1->has_result_id_ == true) {
        uVar3 = Instruction::GetSingleWordOperand(pIVar1,(uint)pIVar1->has_type_id_);
      }
      bVar5 = uVar2 == uVar3;
      if (bVar5) {
        return bVar5;
      }
      this_00 = (this->super_MemPass).super_Pass.context_;
      if ((this_00->valid_analyses_ & kAnalysisStructuredCFG) == kAnalysisNone) {
        IRContext::BuildStructuredCFGAnalysis(this_00);
      }
      uStack_38 = CONCAT44(uVar2,(undefined4)uStack_38);
      iVar4 = std::
              _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_spvtools::opt::StructuredCFGAnalysis::ConstructInfo>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::StructuredCFGAnalysis::ConstructInfo>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
              ::find(&(((this_00->struct_cfg_analysis_)._M_t.
                        super___uniq_ptr_impl<spvtools::opt::StructuredCFGAnalysis,_std::default_delete<spvtools::opt::StructuredCFGAnalysis>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_spvtools::opt::StructuredCFGAnalysis_*,_std::default_delete<spvtools::opt::StructuredCFGAnalysis>_>
                        .super__Head_base<0UL,_spvtools::opt::StructuredCFGAnalysis_*,_false>.
                       _M_head_impl)->bb_to_construct_)._M_h,
                     (key_type_conflict *)((long)&uStack_38 + 4));
      if (iVar4.
          super__Node_iterator_base<std::pair<const_unsigned_int,_spvtools::opt::StructuredCFGAnalysis::ConstructInfo>,_false>
          ._M_cur == (__node_type *)0x0) goto LAB_005211e4;
      uVar2 = *(uint32_t *)
               ((long)iVar4.
                      super__Node_iterator_base<std::pair<const_unsigned_int,_spvtools::opt::StructuredCFGAnalysis::ConstructInfo>,_false>
                      ._M_cur + 0xc);
    } while (uVar2 != 0);
  }
  return bVar5;
}

Assistant:

bool AggressiveDCEPass::BlockIsInConstruct(BasicBlock* header_block,
                                           BasicBlock* bb) {
  if (bb == nullptr || header_block == nullptr) {
    return false;
  }

  uint32_t current_header = bb->id();
  while (current_header != 0) {
    if (current_header == header_block->id()) return true;
    current_header = context()->GetStructuredCFGAnalysis()->ContainingConstruct(
        current_header);
  }
  return false;
}